

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall
google::protobuf::DescriptorBuilder::LookupSymbol
          (DescriptorBuilder *this,string *name,string *relative_to,PlaceholderType placeholder_type
          ,ResolveMode resolve_mode,bool build_it)

{
  bool bVar1;
  Symbol SVar2;
  bool build_it_local;
  ResolveMode resolve_mode_local;
  PlaceholderType placeholder_type_local;
  string *relative_to_local;
  string *name_local;
  DescriptorBuilder *this_local;
  Symbol result;
  
  SVar2 = LookupSymbolNoPlaceholder(this,name,relative_to,resolve_mode,build_it);
  result._0_8_ = SVar2.field_1;
  this_local = (DescriptorBuilder *)CONCAT44(this_local._4_4_,SVar2.type);
  bVar1 = Symbol::IsNull((Symbol *)&this_local);
  if ((bVar1) && ((this->pool_->allow_unknown_ & 1U) != 0)) {
    SVar2 = DescriptorPool::NewPlaceholderWithMutexHeld(this->pool_,name,placeholder_type);
    result._0_8_ = SVar2.field_1;
    this_local = (DescriptorBuilder *)(ulong)SVar2.type;
  }
  SVar2._0_8_ = (ulong)this_local & 0xffffffff;
  SVar2.field_1 = (anon_union_8_8_13f84498_for_Symbol_2)result._0_8_;
  return SVar2;
}

Assistant:

Symbol DescriptorBuilder::LookupSymbol(
    const string& name, const string& relative_to,
    DescriptorPool::PlaceholderType placeholder_type, ResolveMode resolve_mode,
    bool build_it) {
  Symbol result =
      LookupSymbolNoPlaceholder(name, relative_to, resolve_mode, build_it);
  if (result.IsNull() && pool_->allow_unknown_) {
    // Not found, but AllowUnknownDependencies() is enabled.  Return a
    // placeholder instead.
    result = pool_->NewPlaceholderWithMutexHeld(name, placeholder_type);
  }
  return result;
}